

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_double_value
          (basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,double val,ser_context *context,string_type *str,error_code *ec)

{
  pointer pcVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view_type local_20;
  
  if ((ulong)ABS(val) < 0x7ff0000000000000) {
    jsoncons::detail::write_double::operator()(&this->fp_,val,str);
    return;
  }
  if (NAN(val)) {
    if (this->enable_nan_to_num_ == true) {
      pcVar1 = (this->nan_to_num_)._M_dataplus._M_p;
      goto LAB_003261b1;
    }
    if (this->enable_nan_to_str_ == true) {
      local_20._M_str = (this->nan_to_str_)._M_dataplus._M_p;
      local_20._M_len = (this->nan_to_str_)._M_string_length;
      goto LAB_0032615d;
    }
  }
  else if (val < INFINITY) {
    if (this->enable_neginf_to_num_ == true) {
      pcVar1 = (this->neginf_to_num_)._M_dataplus._M_p;
      goto LAB_003261b1;
    }
    if (this->enable_neginf_to_str_ == true) {
      local_20._M_str = (this->neginf_to_str_)._M_dataplus._M_p;
      local_20._M_len = (this->neginf_to_str_)._M_string_length;
      goto LAB_0032615d;
    }
  }
  else {
    if (this->enable_inf_to_num_ == true) {
      pcVar1 = (this->inf_to_num_)._M_dataplus._M_p;
      goto LAB_003261b1;
    }
    if (this->enable_inf_to_str_ == true) {
      local_20._M_str = (this->inf_to_str_)._M_dataplus._M_p;
      local_20._M_len = (this->inf_to_str_)._M_string_length;
LAB_0032615d:
      visit_string(this,&local_20,none,context,ec);
      return;
    }
  }
  bVar2 = null_constant();
  pcVar1 = bVar2._M_str;
  null_constant();
LAB_003261b1:
  std::__cxx11::string::append((char *)str,(ulong)pcVar1);
  return;
}

Assistant:

void write_double_value(double val, const ser_context& context, string_type& str, std::error_code& ec)
    {
        if (!std::isfinite(val))
        {
            if ((std::isnan)(val))
            {
                if (enable_nan_to_num_)
                {
                    str.append(nan_to_num_.data(), nan_to_num_.length());
                }
                else if (enable_nan_to_str_)
                {
                    visit_string(nan_to_str_, semantic_tag::none, context, ec);
                }
                else
                {
                    str.append(null_constant().data(), null_constant().size());
                }
            }
            else if (val == std::numeric_limits<double>::infinity())
            {
                if (enable_inf_to_num_)
                {
                    str.append(inf_to_num_.data(), inf_to_num_.length());
                }
                else if (enable_inf_to_str_)
                {
                    visit_string(inf_to_str_, semantic_tag::none, context, ec);
                }
                else
                {
                    str.append(null_constant().data(), null_constant().size());
                }
            }
            else
            {
                if (enable_neginf_to_num_)
                {
                    str.append(neginf_to_num_.data(), neginf_to_num_.length());
                }
                else if (enable_neginf_to_str_)
                {
                    visit_string(neginf_to_str_, semantic_tag::none, context, ec);
                }
                else
                {
                    str.append(null_constant().data(), null_constant().size());
                }
            }
        }
        else
        {
            fp_(val, str);
        }
    }